

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

Test * __thiscall
testing::internal::TestFactoryImpl<leveldb::AddBoundaryInputsTest_TestOneBoundaryFiles_Test>::
CreateTest(TestFactoryImpl<leveldb::AddBoundaryInputsTest_TestOneBoundaryFiles_Test> *this)

{
  Test *this_00;
  TestFactoryImpl<leveldb::AddBoundaryInputsTest_TestOneBoundaryFiles_Test> *this_local;
  
  this_00 = (Test *)operator_new(0x68);
  leveldb::AddBoundaryInputsTest_TestOneBoundaryFiles_Test::
  AddBoundaryInputsTest_TestOneBoundaryFiles_Test
            ((AddBoundaryInputsTest_TestOneBoundaryFiles_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override { return new TestClass; }